

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O0

void nes_render_fds(void *chip_fds,UINT32 samples,DEV_SMPL **outputs)

{
  int local_2c;
  int local_28;
  INT32 Buffer [2];
  UINT32 CurSmpl;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *chip_fds_local;
  
  unique0x10000052 = outputs;
  for (Buffer[0] = 0; (uint)Buffer[0] < samples; Buffer[0] = Buffer[0] + 1) {
    NES_FDS_Render(chip_fds,&local_2c);
    (*stack0xffffffffffffffe0)[(uint)Buffer[0]] =
         local_2c + (*stack0xffffffffffffffe0)[(uint)Buffer[0]];
    stack0xffffffffffffffe0[1][(uint)Buffer[0]] =
         local_28 + stack0xffffffffffffffe0[1][(uint)Buffer[0]];
  }
  return;
}

Assistant:

static void nes_render_fds(void* chip_fds, UINT32 samples, DEV_SMPL** outputs)
{
	UINT32 CurSmpl;
	INT32 Buffer[2];
	
	for (CurSmpl = 0; CurSmpl < samples; CurSmpl ++)
	{
		NES_FDS_Render(chip_fds, &Buffer[0]);
		outputs[0][CurSmpl] += Buffer[0];
		outputs[1][CurSmpl] += Buffer[1];
	}
	
	return;
}